

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void quantize_fs_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                       int num_rows)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  jpeg_color_quantizer *pjVar5;
  JSAMPLE *pJVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  JSAMPLE *range_limit;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int ci;
  int dirnc;
  int dir;
  int nc;
  int pixcode;
  JSAMPROW colormap_ci;
  JSAMPROW colorindex_ci;
  JSAMPROW output_ptr;
  JSAMPROW input_ptr;
  FSERRPTR errorptr;
  LOCFSERROR delta;
  LOCFSERROR bnexterr;
  LOCFSERROR bpreverr;
  LOCFSERROR belowerr;
  LOCFSERROR cur;
  my_cquantize_ptr cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar5 = cinfo->cquantize;
  iVar3 = cinfo->out_color_components;
  uVar4 = cinfo->output_width;
  pJVar6 = cinfo->sample_range_limit;
  for (width = 0; (int)width < num_rows; width = width + 1) {
    memset(output_buf[(int)width],0,(ulong)uVar4);
    for (col = 0; (int)col < iVar3; col = col + 1) {
      output_ptr = input_buf[(int)width] + (int)col;
      colorindex_ci = output_buf[(int)width];
      if (*(int *)&pjVar5[4].finish_pass == 0) {
        ci = 1;
        input_ptr = (JSAMPROW)(&pjVar5[3].finish_pass)[(int)col];
        row = iVar3;
      }
      else {
        output_ptr = output_ptr + (uVar4 - 1) * iVar3;
        colorindex_ci = colorindex_ci + (uVar4 - 1);
        ci = -1;
        input_ptr = (JSAMPROW)((&pjVar5[3].finish_pass)[(int)col] + (ulong)(uVar4 + 1) * 2);
        row = -iVar3;
      }
      lVar7 = *(long *)(pjVar5[1].finish_pass + (long)(int)col * 8);
      lVar8 = *(long *)(pjVar5[1].start_pass + (long)(int)col * 8);
      bpreverr = 0;
      delta = 0;
      bnexterr = 0;
      for (range_limit._4_4_ = uVar4; range_limit._4_4_ != 0;
          range_limit._4_4_ = range_limit._4_4_ - 1) {
        bVar1 = pJVar6[(int)((uint)*output_ptr +
                            (bpreverr + *(short *)(input_ptr + (long)ci * 2) + 8 >> 4))];
        bVar2 = *(byte *)(lVar7 + (int)(uint)bVar1);
        *colorindex_ci = *colorindex_ci + bVar2;
        iVar9 = (uint)bVar1 - (uint)*(byte *)(lVar8 + (int)(uint)bVar2);
        *(short *)input_ptr = (short)delta + (short)iVar9 * 3;
        delta = bnexterr + iVar9 * 5;
        bpreverr = iVar9 * 7;
        output_ptr = output_ptr + row;
        colorindex_ci = colorindex_ci + ci;
        input_ptr = input_ptr + (long)ci * 2;
        bnexterr = iVar9;
      }
      *(short *)input_ptr = (short)delta;
    }
    *(uint *)&pjVar5[4].finish_pass = (uint)(*(int *)&pjVar5[4].finish_pass == 0);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_fs_dither (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		    JSAMPARRAY output_buf, int num_rows)
/* General case, with Floyd-Steinberg dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register LOCFSERROR cur;	/* current error or pixel value */
  LOCFSERROR belowerr;		/* error for pixel below cur */
  LOCFSERROR bpreverr;		/* error for below/prev col */
  LOCFSERROR bnexterr;		/* error for below/next col */
  LOCFSERROR delta;
  register FSERRPTR errorptr;	/* => fserrors[] at column before current */
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  JSAMPROW colormap_ci;
  int pixcode;
  int nc = cinfo->out_color_components;
  int dir;			/* 1 for left-to-right, -1 for right-to-left */
  int dirnc;			/* dir * nc */
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  SHIFT_TEMPS

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    FMEMZERO((void FAR *) output_buf[row],
	     (size_t) (width * SIZEOF(JSAMPLE)));
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      if (cquantize->on_odd_row) {
	/* work right to left in this row */
	input_ptr += (width-1) * nc; /* so point to rightmost pixel */
	output_ptr += width-1;
	dir = -1;
	dirnc = -nc;
	errorptr = cquantize->fserrors[ci] + (width+1); /* => entry after last column */
      } else {
	/* work left to right in this row */
	dir = 1;
	dirnc = nc;
	errorptr = cquantize->fserrors[ci]; /* => entry before first column */
      }
      colorindex_ci = cquantize->colorindex[ci];
      colormap_ci = cquantize->sv_colormap[ci];
      /* Preset error values: no error propagated to first pixel from left */
      cur = 0;
      /* and no error propagated to row below yet */
      belowerr = bpreverr = 0;

      for (col = width; col > 0; col--) {
	/* cur holds the error propagated from the previous pixel on the
	 * current line.  Add the error propagated from the previous line
	 * to form the complete error correction term for this pixel, and
	 * round the error term (which is expressed * 16) to an integer.
	 * RIGHT_SHIFT rounds towards minus infinity, so adding 8 is correct
	 * for either sign of the error value.
	 * Note: errorptr points to *previous* column's array entry.
	 */
	cur = RIGHT_SHIFT(cur + errorptr[dir] + 8, 4);
	/* Form pixel value + error, and range-limit to 0..MAXJSAMPLE.
	 * The maximum error is +- MAXJSAMPLE; this sets the required size
	 * of the range_limit array.
	 */
	cur += GETJSAMPLE(*input_ptr);
	cur = GETJSAMPLE(range_limit[cur]);
	/* Select output value, accumulate into output code for this pixel */
	pixcode = GETJSAMPLE(colorindex_ci[cur]);
	*output_ptr += (JSAMPLE) pixcode;
	/* Compute actual representation error at this pixel */
	/* Note: we can do this even though we don't have the final */
	/* pixel code, because the colormap is orthogonal. */
	cur -= GETJSAMPLE(colormap_ci[pixcode]);
	/* Compute error fractions to be propagated to adjacent pixels.
	 * Add these into the running sums, and simultaneously shift the
	 * next-line error sums left by 1 column.
	 */
	bnexterr = cur;
	delta = cur * 2;
	cur += delta;		/* form error * 3 */
	errorptr[0] = (FSERROR) (bpreverr + cur);
	cur += delta;		/* form error * 5 */
	bpreverr = belowerr + cur;
	belowerr = bnexterr;
	cur += delta;		/* form error * 7 */
	/* At this point cur contains the 7/16 error value to be propagated
	 * to the next pixel on the current line, and all the errors for the
	 * next line have been shifted over. We are therefore ready to move on.
	 */
	input_ptr += dirnc;	/* advance input ptr to next column */
	output_ptr += dir;	/* advance output ptr to next column */
	errorptr += dir;	/* advance errorptr to current column */
      }
      /* Post-loop cleanup: we must unload the final error value into the
       * final fserrors[] entry.  Note we need not unload belowerr because
       * it is for the dummy column before or after the actual array.
       */
      errorptr[0] = (FSERROR) bpreverr; /* unload prev err into array */
    }
    cquantize->on_odd_row = (cquantize->on_odd_row ? FALSE : TRUE);
  }
}